

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

uint __thiscall trompeloeil::sequence_type::cost(sequence_type *this,sequence_matcher *m)

{
  bool bVar1;
  sequence_matcher *this_00;
  sequence_matcher *e;
  iterator __end1;
  iterator __begin1;
  list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer> *__range1;
  uint sequence_cost;
  sequence_matcher *m_local;
  sequence_type *this_local;
  
  __range1._4_4_ = 0;
  __end1 = list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer>::begin
                     ((list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer> *)this);
  e = (sequence_matcher *)
      list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer>::end
                ((list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer> *)this);
  while( true ) {
    bVar1 = operator!=(&__end1,(iterator *)&e);
    if (!bVar1) {
      return 0xffffffff;
    }
    this_00 = list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer>::iterator::operator*
                        (&__end1);
    if (this_00 == m) break;
    bVar1 = sequence_matcher::is_satisfied(this_00);
    if (!bVar1) {
      return 0xffffffff;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    list<trompeloeil::sequence_matcher,_trompeloeil::ignore_disposer>::iterator::operator++(&__end1)
    ;
  }
  return __range1._4_4_;
}

Assistant:

const
  noexcept
  {
    unsigned sequence_cost = 0U;
    for (auto& e : matchers)
    {
      if (&e == m) return sequence_cost;
      if (!e.is_satisfied())
      {
        return ~0U;
      }
      ++sequence_cost;
    }
    return ~0U;
  }